

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_atrophy(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  const_reference pvVar2;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_EDI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  
  bVar1 = is_affected(in_RCX,in_EDI);
  if (bVar1) {
    if (in_RCX == in_RDX) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  else {
    bVar1 = saves_spell(in_stack_ffffffffffffffb0,
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffa4);
    if (!bVar1) {
      pvVar2 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                         (&race_table,(long)in_RCX->race);
      bVar1 = str_cmp(pvVar2->name,"troll");
      if (bVar1) {
        init_affect((AFFECT_DATA *)0x621af5);
        number_range(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
        ;
        send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
            (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
            (void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
        return;
      }
    }
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

void spell_atrophy(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already wasting away.\n\r", ch);
		else
			send_to_char("They are already wasting away.\n\r", ch);

		return;
	}

	if (saves_spell(level, victim, DAM_OTHER) || !str_cmp(race_table[victim->race].name, "troll"))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.duration = level / 7;
	af.location = APPLY_REGENERATION;
	af.modifier = number_range(-3, -level / 12);
	af.level = level;
	af.mod_name = MOD_REGEN;
	affect_to_char(victim, &af);

	send_to_char("You feel an intense pain as your body begins to waste away.\n\r", victim);
	act("$n looks very sick as $s body starts wasting away before your eyes!", victim, nullptr, nullptr, TO_ROOM);
}